

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O1

void printcmd(uint32_t off,uint32_t length)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = 0;
  printf("0x%08x:",off);
  if (length != 0) {
    uVar2 = 0;
    do {
      printf(" %02x",(ulong)bios->data[off + (int)uVar2]);
      uVar2 = uVar2 + 1;
    } while (length != uVar2);
  }
  if ((uint)uVar2 < 0x10) {
    iVar1 = (uint)uVar2 - 0x10;
    do {
      printf("   ");
      iVar1 = iVar1 + 1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void printcmd (uint32_t off, uint32_t length) {
	printf ("0x%08x:", off);
	int i;
	for (i = 0; i < length; i++)
		printf(" %02x", bios->data[off+i]);
	for (; i < 16; i++)
		printf ("   ");
}